

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IsGroupOf_PDU::AddGED(IsGroupOf_PDU *this,GEDItem *GED)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  GED *pGVar4;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  GEDItem *local_18;
  GEDItem *GED_local;
  IsGroupOf_PDU *this_local;
  
  bVar1 = this->m_ui8GrpdEntCat;
  local_18 = GED;
  GED_local = (GEDItem *)this;
  pGVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::operator->(GED);
  uVar2 = (*(pGVar4->super_DataTypeBase)._vptr_DataTypeBase[6])();
  if (bVar1 != uVar2) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AddGED",&local_39);
    KException::KException(this_00,&local_38,8);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ::push_back(&this->m_vpGED,local_18);
  this->m_ui8NumOfGroupedEnts = this->m_ui8NumOfGroupedEnts + '\x01';
  pGVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::operator->(local_18);
  iVar3 = (*(pGVar4->super_DataTypeBase)._vptr_DataTypeBase[7])();
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + (ushort)(byte)iVar3;
  return;
}

Assistant:

void IsGroupOf_PDU::AddGED(const GEDItem &GED) noexcept(false)
{
    if( m_ui8GrpdEntCat != GED->GetGroupedEntityCategory() )throw KException( __FUNCTION__, INVALID_DATA );

    m_vpGED.push_back( GED );
    ++m_ui8NumOfGroupedEnts;
    m_ui16PDULength += GED->GetLength();
}